

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_session.c
# Opt level: O1

void div_type(http_request *req)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  char *pcVar7;
  
  iVar2 = strcmp(req->uri,"/");
  if (iVar2 == 0) {
    req->f_type = ROOT;
  }
  else {
    sVar5 = strlen(req->file);
    uVar3 = (uint)sVar5;
    pcVar7 = req->address + (sVar5 & 0xffffffff) + 0xf;
    do {
      uVar4 = (uint)sVar5;
      uVar6 = (int)uVar3 >> 0x1f & uVar3;
      if ((int)uVar4 < 1) break;
      sVar5 = (size_t)(uVar4 - 1);
      cVar1 = *pcVar7;
      pcVar7 = pcVar7 + -1;
      uVar6 = uVar4;
    } while (cVar1 != '.');
    if ((int)uVar6 < 2) {
      req->f_type = NDIR;
    }
    else {
      req->f_type = NFILE;
    }
  }
  return;
}

Assistant:

void div_type(struct http_request *req) {
    if(strcmp(req->uri, "/") == 0){
        req->f_type = ROOT;
        return;
    }
    int len = 0;
    len = (int)strlen(req->file);
    int dot = len - 1;
    while( dot >= 0 && req->file[dot] != '.'){
        dot--;
    }
    if(dot <= 0){
        req->f_type = NDIR;
    } else {
        req->f_type = NFILE;
    }
}